

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
VCFrontEnd::genOutputFileName(string *in_file,Options *opts)

{
  char *__command;
  ostream *poVar1;
  ulong *in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string out_folder;
  string name;
  string folder;
  size_t k;
  stringstream ss;
  string *this;
  string *__lhs;
  allocator *__lhs_00;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [55];
  allocator local_1c9;
  string local_1c8 [32];
  long local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  ulong *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8 = std::__cxx11::string::find_last_of((char)local_10,0x2f);
  __lhs_00 = &local_1c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,".",__lhs_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::string::string(local_200,local_10);
  if (local_1a8 != -1) {
    std::__cxx11::string::substr((ulong)local_220,(ulong)local_10);
    std::__cxx11::string::operator=(local_1c8,local_220);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::substr((ulong)local_240,(ulong)local_10);
    std::__cxx11::string::operator=(local_200,local_240);
    std::__cxx11::string::~string(local_240);
  }
  __lhs = local_200;
  std::__cxx11::string::find_last_of('\0',0x2e);
  std::__cxx11::string::substr((ulong)local_260,(ulong)__lhs);
  this = local_260;
  std::__cxx11::string::operator=(local_200,this);
  std::__cxx11::string::~string(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)this);
  std::operator+((char *)__lhs_00,in_RDI);
  __command = (char *)std::__cxx11::string::c_str();
  system(__command);
  std::__cxx11::string::~string(local_2a0);
  poVar1 = std::operator<<(local_190,local_280);
  poVar1 = std::operator<<(poVar1,"/");
  std::operator<<(poVar1,local_200);
  if ((*(byte *)((long)local_18 + 9) & 1) == 0) {
    if ((local_18[1] & 1) == 0) {
      std::operator<<(local_190,"_uni");
    }
    else {
      std::operator<<(local_190,"_adp");
    }
  }
  else {
    std::operator<<(local_190,"_ais");
  }
  if ((*(byte *)((long)local_18 + 10) & 1) != 0) {
    std::operator<<(local_190,"_q");
  }
  if ((*(byte *)((long)local_18 + 0xb) & 1) != 0) {
    std::operator<<(local_190,"_v");
  }
  if (*(int *)((long)local_18 + 0xc) != 2) {
    poVar1 = std::operator<<(local_190,"_r");
    std::ostream::operator<<(poVar1,*(int *)((long)local_18 + 0xc));
  }
  poVar1 = std::operator<<(local_190,"_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_18);
  std::operator<<(poVar1,".obj");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

string VCFrontEnd::genOutputFileName(const string& in_file, const VertexClustering::Options& opts)
{
	stringstream ss;
	size_t k = in_file.find_last_of('/');
	string folder = ".", name = in_file;
	if (k != string::npos) {
		folder = in_file.substr(0, k);
		name = in_file.substr(k + 1);
	}
	name = name.substr(0, name.find_last_of('.'));
	string out_folder = folder + "/outputs";
#if defined(_WIN32)
	CreateDirectory(out_folder.c_str(), NULL);
#else
	system(("mkdir -p " + out_folder).c_str());
#endif
	ss << out_folder << "/" << name;
	if (opts.anisotropic)    ss << "_ais";
	else if (opts.adaptive)  ss << "_adp";
	else                     ss << "_uni";
	if (opts.quadMetric)     ss << "_q";
	if (opts.validation)     ss << "_v";
	if (opts.ringLevel != 2) ss << "_r" << opts.ringLevel;
	ss << "_" << opts.numCluster << ".obj";
	return ss.str();
}